

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::possiblyUseLiDualSteepestEdge(HEkkDual *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long in_RDI;
  HighsSimplexInfo *info;
  HighsOptions *options;
  HighsLp *in_stack_00000070;
  HighsLogOptions *in_stack_00000078;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0x10) + 8);
  lVar2 = *(long *)(in_RDI + 0x10);
  *(undefined1 *)(lVar2 + 0x28c9) = 1;
  if ((((*(byte *)(lVar1 + 0x2b0) & 1) != 0) &&
      (bVar3 = isLessInfeasibleDSECandidate(in_stack_00000078,in_stack_00000070), bVar3)) &&
     ((*(byte *)(lVar1 + 0x2b1) & 1) != 0)) {
    *(undefined1 *)(lVar2 + 0x28c9) = 0;
  }
  return;
}

Assistant:

void HEkkDual::possiblyUseLiDualSteepestEdge() {
  // Decide whether to use LiDSE by not storing squared primal infeasibilities
  HighsOptions& options = *ekk_instance_.options_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  info.store_squared_primal_infeasibility = true;
  if (options.less_infeasible_DSE_check) {
    if (isLessInfeasibleDSECandidate(options.log_options, ekk_instance_.lp_)) {
      // LP is a candidate for LiDSE
      if (options.less_infeasible_DSE_choose_row)
        // Use LiDSE
        info.store_squared_primal_infeasibility = false;
    }
  }
}